

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbis.c
# Opt level: O0

void vorbis_stream_destroy(vorbis_stream_t *vorbis)

{
  int local_14;
  int i;
  vorbis_stream_t *vorbis_local;
  
  ogg_page_destroy(&vorbis->page);
  vorbis->segment = '\0';
  for (local_14 = 0; local_14 < 10; local_14 = local_14 + 1) {
    ogg_page_destroy(vorbis->hdr_pages + local_14);
  }
  buf_free(&vorbis->id_hdr);
  buf_free(&vorbis->comment_hdr);
  buf_free(&vorbis->setup_hdr);
  return;
}

Assistant:

void vorbis_stream_destroy(vorbis_stream_t *vorbis) {
  ogg_page_destroy(&vorbis->page);
  vorbis->segment = 0;

  int i;
  for (i = 0; i < VORBIS_MAX_HDR_PAGES; i++)
    ogg_page_destroy(vorbis->hdr_pages + i);

  buf_free(&vorbis->id_hdr);
  buf_free(&vorbis->comment_hdr);
  buf_free(&vorbis->setup_hdr);  
}